

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O2

void __thiscall
jrtplib::
RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
::~RTPKeyHashTable(RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
                   *this)

{
  ~RTPKeyHashTable(this);
  operator_delete(this,0x10418);
  return;
}

Assistant:

~RTPKeyHashTable()					{ Clear(); }